

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O0

void __thiscall FileSendSession::on_output(FileSendSession *this,Poll *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__buf;
  ssize_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  path local_88;
  path local_68;
  int local_48;
  int n;
  path local_38;
  Poll *local_18;
  Poll *p_local;
  FileSendSession *this_local;
  
  local_18 = p;
  p_local = (Poll *)this;
  bVar1 = SendBuffer::is_all_read(&this->buff);
  if (bVar1) {
    std::istream::read((char *)&this->stream,0x1aa790);
    iVar2 = std::istream::gcount();
    SendBuffer::load_bytes(&this->buff,FILE_SEND_BUF,iVar2);
    uVar6 = std::ios::operator!((ios *)(&(this->stream).
                                         super_basic_fstream<char,_std::char_traits<char>_>.
                                         field_0x0 +
                                       *(long *)(*(long *)&(this->stream).
                                                                                                                      
                                                  super_basic_fstream<char,_std::char_traits<char>_>
                                                + -0x18)));
    if (((uVar6 & 1) != 0) && (uVar6 = std::ios::eof(), (uVar6 & 1) == 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
      std::operator<<(poVar5,": Error in reading from file, disconnecting\n");
      bVar1 = std::function::operator_cast_to_bool((function *)&this->error);
      if (bVar1) {
        boost::filesystem::path::path(&local_38,&this->file);
        std::function<void_(boost::filesystem::path)>::operator()(&this->error,&local_38);
        boost::filesystem::path::~path(&local_38);
      }
      Poll::unsubscribe(local_18,&this->super_Subscriber);
      return;
    }
  }
  iVar2 = Subscriber::get_fd(&this->super_Subscriber);
  __buf = SendBuffer::read_pos(&this->buff);
  iVar3 = SendBuffer::remaining_to_read(&this->buff);
  sVar4 = write(iVar2,__buf,(long)iVar3);
  local_48 = (int)sVar4;
  if (local_48 < 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
    std::operator<<(poVar5,": Error in writing to socket, disconnecting\n");
    bVar1 = std::function::operator_cast_to_bool((function *)&this->error);
    if (bVar1) {
      boost::filesystem::path::path(&local_68,&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->error,&local_68);
      boost::filesystem::path::~path(&local_68);
    }
    Poll::unsubscribe(local_18,&this->super_Subscriber);
  }
  else {
    SendBuffer::on_read_bytes(&this->buff,local_48);
    bVar1 = SendBuffer::is_all_read(&this->buff);
    if ((bVar1) && (uVar6 = std::ios::eof(), (uVar6 & 1) != 0)) {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->success);
      if (bVar1) {
        boost::filesystem::path::path(&local_88,&this->file);
        std::function<void_(boost::filesystem::path)>::operator()(&this->success,&local_88);
        boost::filesystem::path::~path(&local_88);
      }
      Poll::unsubscribe(local_18,&this->super_Subscriber);
    }
  }
  return;
}

Assistant:

void FileSendSession::on_output(Poll &p) {
  if (buff.is_all_read()) {
    stream.read(FILE_SEND_BUF, FILE_SEND_BUF_SIZE);
    buff.load_bytes(FILE_SEND_BUF, stream.gcount());
    if (!stream && !stream.eof()) {
      std::cout << this->name << ": Error in reading from file, disconnecting\n";
      if (this->error)
        this->error(file);
      p.unsubscribe(*this);
      return;
    }
  }
  int n = write(this->get_fd(), buff.read_pos(), buff.remaining_to_read());
  if (n < 0) {
    std::cout << this->name << ": Error in writing to socket, disconnecting\n";
    if (this->error)
      this->error(file);
    p.unsubscribe(*this);
    return;
  }
  buff.on_read_bytes(n);
  if (buff.is_all_read() && stream.eof()) {
    if (this->success)
      this->success(file);
    p.unsubscribe(*this);
  }
}